

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh-certs.c
# Opt level: O0

int opensshcert_pubkey_bits(ssh_keyalg *self,ptrlen blob)

{
  ssh_keyalg *self_00;
  int iVar1;
  ptrlen blob_00;
  undefined1 local_48 [8];
  BinarySource src [1];
  ssh_keyalg *self_local;
  ptrlen blob_local;
  
  src[0].binarysource_ = (BinarySource *)self;
  BinarySource_INIT__((BinarySource *)local_48,blob);
  BinarySource_get_string((BinarySource *)src[0]._24_8_);
  BinarySource_get_string((BinarySource *)src[0]._24_8_);
  self_00 = (ssh_keyalg *)src[0].binarysource_[5].data;
  blob_00 = make_ptrlen((void *)(*(long *)src[0]._24_8_ + *(long *)(src[0]._24_8_ + 8)),
                        *(long *)(src[0]._24_8_ + 0x10) - *(long *)(src[0]._24_8_ + 8));
  iVar1 = ssh_key_public_bits(self_00,blob_00);
  return iVar1;
}

Assistant:

static int opensshcert_pubkey_bits(const ssh_keyalg *self, ptrlen blob)
{
    BinarySource src[1];
    BinarySource_BARE_INIT_PL(src, blob);

    get_string(src);                   /* key type */
    get_string(src);                   /* nonce */
    return ssh_key_public_bits(
        self->base_alg, make_ptrlen(get_ptr(src), get_avail(src)));
}